

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_value.h
# Opt level: O0

indirect_value<int,_EmptyNo_FinalNo,_EmptyNo_FinalNo> * __thiscall
isocpp_p1950::indirect_value<int,_EmptyNo_FinalNo,_EmptyNo_FinalNo>::operator=
          (indirect_value<int,_EmptyNo_FinalNo,_EmptyNo_FinalNo> *this,
          indirect_value<int,_EmptyNo_FinalNo,_EmptyNo_FinalNo> *i)

{
  int *piVar1;
  void *local_20;
  indirect_value<int,_EmptyNo_FinalNo,_EmptyNo_FinalNo> *local_18;
  indirect_value<int,_EmptyNo_FinalNo,_EmptyNo_FinalNo> *i_local;
  indirect_value<int,_EmptyNo_FinalNo,_EmptyNo_FinalNo> *this_local;
  
  if (this != i) {
    local_18 = i;
    i_local = this;
    reset(this);
    indirect_value_copy_base<EmptyNo_FinalNo,_false>::operator=
              (&this->super_indirect_value_copy_base<EmptyNo_FinalNo,_false>,
               &local_18->super_indirect_value_copy_base<EmptyNo_FinalNo,_false>);
    indirect_value_delete_base<EmptyNo_FinalNo,_false>::operator=
              (&this->super_indirect_value_delete_base<EmptyNo_FinalNo,_false>,
               &local_18->super_indirect_value_delete_base<EmptyNo_FinalNo,_false>);
    local_20 = (void *)0x0;
    piVar1 = std::exchange<int*,decltype(nullptr)>(&local_18->ptr_,&local_20);
    this->ptr_ = piVar1;
  }
  return this;
}

Assistant:

constexpr indirect_value& operator=(indirect_value&& i) noexcept {
    if (this != &i) {
      reset();
      copy_base::operator=(std::move(i));
      delete_base::operator=(std::move(i));
      ptr_ = std::exchange(i.ptr_, nullptr);
    }
    return *this;
  }